

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteGraph.h
# Opt level: O0

RWSubgraph * __thiscall dg::dda::ReadWriteGraph::createSubgraph(ReadWriteGraph *this)

{
  vector<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
  *this_00;
  pointer pRVar1;
  RWSubgraph **in_RDI;
  RWSubgraph *this_01;
  
  this_01 = (RWSubgraph *)(in_RDI + 4);
  this_00 = (vector<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
             *)operator_new(0x50);
  memset(this_00,0,0x50);
  RWSubgraph::RWSubgraph(this_01);
  std::
  vector<std::unique_ptr<dg::dda::RWSubgraph,std::default_delete<dg::dda::RWSubgraph>>,std::allocator<std::unique_ptr<dg::dda::RWSubgraph,std::default_delete<dg::dda::RWSubgraph>>>>
  ::emplace_back<dg::dda::RWSubgraph*>(this_00,in_RDI);
  std::
  vector<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
  ::back((vector<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
          *)this_01);
  pRVar1 = std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>::get
                     ((unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_> *)
                      0x19b030);
  return pRVar1;
}

Assistant:

RWSubgraph &createSubgraph() {
        _subgraphs.emplace_back(new RWSubgraph());
        return *_subgraphs.back().get();
    }